

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.h
# Opt level: O2

basic_ostream<char,_std::char_traits<char>_> *
mjs::operator<<(basic_ostream<char,_std::char_traits<char>_> *os,value_type t)

{
  char *pcVar1;
  ostream *poVar2;
  
  pcVar1 = string_value(t);
  poVar2 = std::operator<<(os,pcVar1);
  return poVar2;
}

Assistant:

std::basic_ostream<CharT, CharTraitsT>& operator<<(std::basic_ostream<CharT, CharTraitsT>& os, value_type t) {
    return os << string_value(t);
}